

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O1

uint64_t sum_quotients_vec<unsigned_int,libdivide::divider<unsigned_int,(libdivide::Branching)0>>
                   (random_numerators<unsigned_int> *vals,
                   divider<unsigned_int,_(libdivide::Branching)0> *div)

{
  byte bVar1;
  undefined1 auVar2 [12];
  size_t i;
  UIntT_conflict sum;
  uint uVar3;
  long lVar4;
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 local_c0 [2] [64];
  
  auVar11 = ZEXT1664((undefined1  [16])0x0);
  vmovdqa64_avx512f(auVar11);
  if ((ulong)vals->_length != 0) {
    bVar1 = (div->div).denom.more;
    auVar5 = vpbroadcastd_avx512f();
    auVar6 = vpbroadcastd_avx512f();
    lVar4 = 0;
    do {
      auVar7 = vmovdqa64_avx512f(*(undefined1 (*) [64])((long)vals->_pData + lVar4));
      if ((div->div).denom.magic == 0) {
        auVar7 = vpsrld_avx512f(auVar7,ZEXT116(bVar1));
      }
      else {
        auVar8 = vpmuludq_avx512f(auVar5,auVar7);
        auVar8 = vpsrlq_avx512f(auVar8,0x20);
        auVar9 = vpsrlq_avx512f(auVar7,0x20);
        auVar9 = vpmuludq_avx512f(auVar5,auVar9);
        auVar9 = vmovdqa32_avx512f(auVar9);
        auVar2._4_8_ = 0;
        auVar2._0_4_ = auVar9._4_4_;
        auVar10._0_12_ = auVar2 << 0x20;
        auVar10._12_4_ = auVar9._12_4_;
        auVar10._16_4_ = 0;
        auVar10._20_4_ = auVar9._20_4_;
        auVar10._24_4_ = 0;
        auVar10._28_4_ = auVar9._28_4_;
        auVar10._32_4_ = 0;
        auVar10._36_4_ = auVar9._36_4_;
        auVar10._40_4_ = 0;
        auVar10._44_4_ = auVar9._44_4_;
        auVar10._48_4_ = 0;
        auVar10._52_4_ = auVar9._52_4_;
        auVar10._60_4_ = auVar9._60_4_;
        auVar10._56_4_ = 0;
        auVar8 = vporq_avx512f(auVar8,auVar10);
        if ((bVar1 & 0x40) == 0) {
          auVar7 = vpsrld_avx512f(auVar8,ZEXT116(bVar1));
        }
        else {
          auVar7 = vpsubd_avx512f(auVar7,auVar8);
          auVar7 = vpsrld_avx512f(auVar7,1);
          auVar7 = vpaddd_avx512f(auVar7,auVar8);
          auVar7 = vpsrlvd_avx512f(auVar7,auVar6);
        }
      }
      auVar11 = vpaddd_avx512f(auVar11,auVar7);
      lVar4 = lVar4 + 0x40;
    } while ((ulong)vals->_length << 2 != lVar4);
  }
  local_c0[0] = vmovdqa64_avx512f(auVar11);
  lVar4 = 0;
  uVar3 = 0;
  do {
    uVar3 = uVar3 + *(int *)(local_c0[0] + lVar4 * 4);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x10);
  return (ulong)uVar3;
}

Assistant:

NOINLINE uint64_t sum_quotients_vec(const random_numerators<IntT> &vals, const Divisor &div) {
    size_t count = sizeof(x86_VECTOR_TYPE) / sizeof(IntT);
    x86_VECTOR_TYPE sumX4 = SETZERO_SI();
    for (auto iter = vals.begin(); iter != vals.end(); iter += count) {
        x86_VECTOR_TYPE numers = LOAD_SI((const x86_VECTOR_TYPE *)iter);
        numers = numers / div;
        sumX4 = add_vector<sizeof(IntT)>(sumX4, numers);
    }
    return unsigned_sum_vals((const IntT *)&sumX4, count);
}